

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_emptyTreeSeek_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_emptyTreeSeek_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  bool match_1;
  iterator e_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  bool match;
  iterator e;
  TypeParam *db;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  string local_938;
  AssertHelper local_918;
  Message local_910;
  bool local_901;
  AssertionResult local_900;
  string local_8f0 [15];
  bool in_stack_fffffffffffff71f;
  undefined8 in_stack_fffffffffffff720;
  AssertHelper local_8d0;
  Message local_8c8;
  bool local_8b9;
  AssertionResult local_8b8;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_8a8;
  bool local_899;
  iterator local_898;
  string local_728;
  AssertHelper local_708;
  Message local_700;
  bool local_6f1;
  AssertionResult local_6f0;
  string local_6e0;
  AssertHelper local_6c0;
  Message local_6b8;
  bool local_6a9;
  AssertionResult local_6a8 [2];
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_688;
  bool local_679;
  iterator local_678;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_508;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)in_stack_fffffffffffff720,in_stack_fffffffffffff71f);
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_678,local_508);
  local_679 = false;
  kVar2 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>(&local_500,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_688.key_bytes,kVar2);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_678,(art_key_type)local_688,&local_679,true);
  local_6a9 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_678);
  local_6a9 = !local_6a9;
  testing::AssertionResult::AssertionResult<bool>(local_6a8,&local_6a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6e0,(internal *)local_6a8,(AssertionResult *)"e.valid()","true","false",in_R9)
    ;
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_6e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x128,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    std::__cxx11::string::~string((string *)&local_6e0);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult(local_6a8);
  local_6f1 = (bool)(~local_679 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_6f0,&local_6f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_728,(internal *)&local_6f0,(AssertionResult *)0x30452b,"true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_728);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    std::__cxx11::string::~string((string *)&local_728);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult(&local_6f0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_678);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_898,local_508);
  local_899 = false;
  kVar2 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>(&local_500,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_8a8.key_bytes,kVar2);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_898,(art_key_type)local_8a8,&local_899,false);
  local_8b9 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_898);
  local_8b9 = !local_8b9;
  testing::AssertionResult::AssertionResult<bool>(&local_8b8,&local_8b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8b8);
  if (!bVar1) {
    testing::Message::Message(&local_8c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_8f0,(internal *)&local_8b8,(AssertionResult *)"e.valid()","true",
               "false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_8f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x130,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper(&local_8d0);
    std::__cxx11::string::~string(local_8f0);
    testing::Message::~Message(&local_8c8);
  }
  testing::AssertionResult::~AssertionResult(&local_8b8);
  local_901 = (bool)(~local_899 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_900,&local_901,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_900);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_938,(internal *)&local_900,(AssertionResult *)0x30452b,"true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_938);
    testing::internal::AssertHelper::AssertHelper
              (&local_918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x131,pcVar3);
    testing::internal::AssertHelper::operator=(&local_918,&local_910);
    testing::internal::AssertHelper::~AssertHelper(&local_918);
    std::__cxx11::string::~string((string *)&local_938);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult(&local_900);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_898);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, emptyTreeSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           true /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           false /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
}